

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

Util * __thiscall Util::toString_abi_cxx11_(Util *this,Anchor anchor)

{
  Anchor AVar1;
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [32];
  stringstream local_1b0 [8];
  stringstream str;
  allocator local_15;
  Anchor local_14;
  Util *pUStack_10;
  Anchor anchor_local;
  
  local_14 = anchor;
  pUStack_10 = this;
  if (anchor == AnchorNone) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"AnchorNone",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    AVar1 = local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"AnchorBottom",&local_1d1);
    enumValueToString(AVar1,2,(string *)local_1d0,(stringstream *)local_1b0,false);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    AVar1 = local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"AnchorHeight",&local_1f9);
    enumValueToString(AVar1,4,(string *)local_1f8,(stringstream *)local_1b0,false);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    AVar1 = local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"AnchorLeft",&local_221);
    enumValueToString(AVar1,0x10,(string *)local_220,(stringstream *)local_1b0,false);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    AVar1 = local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"AnchorRight",&local_249);
    enumValueToString(AVar1,0x20,(string *)local_248,(stringstream *)local_1b0,false);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    AVar1 = local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"AnchorTop",&local_271);
    enumValueToString(AVar1,1,(string *)local_270,(stringstream *)local_1b0,false);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    AVar1 = local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"AnchorWidth",&local_299);
    enumValueToString(AVar1,0x40,(string *)local_298,(stringstream *)local_1b0,true);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return this;
}

Assistant:

std::string Util::toString(Anchor anchor)
{
	if (anchor == AnchorNone)
		return "AnchorNone";
	
	std::stringstream str;

	enumValueToString(anchor, AnchorBottom, "AnchorBottom", str);
	enumValueToString(anchor, AnchorHeight, "AnchorHeight", str);
	enumValueToString(anchor, AnchorLeft, "AnchorLeft", str);
	enumValueToString(anchor, AnchorRight, "AnchorRight", str);
	enumValueToString(anchor, AnchorTop, "AnchorTop", str);
	enumValueToString(anchor, AnchorWidth, "AnchorWidth", str, true);

	return str.str();
}